

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::JavaGeneratorTest::JavaGeneratorTest
          (JavaGeneratorTest *this)

{
  Descriptor *pDVar1;
  string_view name;
  string_view name_00;
  string_view contents;
  string_view contents_00;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_88;
  CodeGenerator *local_80;
  string local_78;
  string local_58;
  string local_38;
  
  CommandLineInterfaceTester::CommandLineInterfaceTester(&this->super_CommandLineInterfaceTester);
  (this->super_CommandLineInterfaceTester).super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTester_01653d08;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"--java_out",&local_89);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"--java_opt",&local_8a);
  std::make_unique<google::protobuf::compiler::java::JavaGenerator>();
  local_88._M_head_impl = local_80;
  local_80 = (CodeGenerator *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Java test generator",&local_8b);
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_78,&local_38,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_88,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (local_88._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_88._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  local_88._M_head_impl = (CodeGenerator *)0x0;
  if (local_80 != (CodeGenerator *)0x0) {
    (**(code **)(*(long *)local_80 + 8))();
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  pDVar1 = DescriptorProto::GetDescriptor();
  FileDescriptor::DebugString_abi_cxx11_(&local_78,pDVar1->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = local_78._M_dataplus._M_p;
  contents._M_len = local_78._M_string_length;
  CommandLineInterfaceTester::CreateTempFile(&this->super_CommandLineInterfaceTester,name,contents);
  std::__cxx11::string::~string((string *)&local_78);
  pDVar1 = pb::JavaFeatures::GetDescriptor();
  FileDescriptor::DebugString_abi_cxx11_(&local_78,pDVar1->file_);
  name_00._M_str = "third_party/java/protobuf/java_features.proto";
  name_00._M_len = 0x2d;
  contents_00._M_str = local_78._M_dataplus._M_p;
  contents_00._M_len = local_78._M_string_length;
  CommandLineInterfaceTester::CreateTempFile
            (&this->super_CommandLineInterfaceTester,name_00,contents_00);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

JavaGeneratorTest() {
    RegisterGenerator("--java_out", "--java_opt",
                      std::make_unique<JavaGenerator>(), "Java test generator");

    // Generate built-in protos.
    CreateTempFile(
        "google/protobuf/descriptor.proto",
        google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
    CreateTempFile("third_party/java/protobuf/java_features.proto",
                   pb::JavaFeatures::descriptor()->file()->DebugString());
  }